

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O0

void __thiscall module::SequentialModule::~SequentialModule(SequentialModule *this)

{
  size_type sVar1;
  reference ppLVar2;
  int local_14;
  int i;
  SequentialModule *this_local;
  
  this->_vptr_SequentialModule = (_func_int **)&PTR__SequentialModule_0010bd30;
  if (this->_in != (tensor)0x0) {
    type::destroyTensor(this->_in);
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::size(&this->_lLayers);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppLVar2 = std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::operator[]
                        (&this->_lLayers,(long)local_14);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<layer::Layer_*,_std::allocator<layer::Layer_*>_>::~vector(&this->_lLayers);
  return;
}

Assistant:

SequentialModule::~SequentialModule()
    {
        if(_in != nullptr) type::destroyTensor(_in);

        for(int i(0); i < _lLayers.size(); i++)
            delete _lLayers[i];
    }